

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua-clientsocket.c
# Opt level: O2

int lreadstdin(lua_State *L)

{
  char *s;
  int iVar1;
  pthread_mutex_t *__mutex;
  int iVar2;
  
  __mutex = (pthread_mutex_t *)lua_touserdata(L,-0xf4629);
  pthread_mutex_lock(__mutex);
  iVar1 = __mutex[1].__data.__lock;
  if (iVar1 == *(int *)((long)__mutex + 0x2c)) {
    pthread_mutex_unlock(__mutex);
    iVar1 = 0;
  }
  else {
    s = *(char **)((long)__mutex + (long)iVar1 * 8 + 0x30);
    iVar2 = 0;
    if (iVar1 < 0x3ff) {
      iVar2 = iVar1 + 1;
    }
    __mutex[1].__data.__lock = iVar2;
    pthread_mutex_unlock(__mutex);
    lua_pushstring(L,s);
    free(s);
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

static int
lreadstdin(lua_State *L) {
	struct queue *q = lua_touserdata(L, lua_upvalueindex(1));
	pthread_mutex_lock(&q->lock);
	if (q->head == q->tail) {
		pthread_mutex_unlock(&q->lock);
		return 0;
	}
	char * str = q->queue[q->head];
	if (++q->head >= QUEUE_SIZE) {
		q->head = 0;
	}
	pthread_mutex_unlock(&q->lock);
	lua_pushstring(L, str);
	free(str);
	return 1;
}